

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void GameLoop::initInstance
               (Map *map,vector<Player_*,_std::allocator<Player_*>_> *playerList,Deck *deck)

{
  if (gameLoopInstance != (GameLoop *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Tried to create an instance of GameLoop, but one already exists!",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    return;
  }
  gameLoopInstance = (GameLoop *)operator_new(0x18);
  gameLoopInstance->gameMap = map;
  gameLoopInstance->allPlayers = playerList;
  gameLoopInstance->gameDeck = deck;
  return;
}

Assistant:

void GameLoop::initInstance(Map* map, vector<Player*>* playerList, Deck* deck) {
    if (GameLoop::gameLoopInstance == nullptr) {
        GameLoop::gameLoopInstance = new GameLoop(map, playerList, deck);
    } else {
        std::cout << "Tried to create an instance of GameLoop, but one already exists!" << std::endl;
    }
}